

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerStep * triggerStepAllocate(Parse *pParse,u8 op,Token *pName,char *zStart,char *zEnd)

{
  sqlite3 *db;
  TriggerStep *pTVar1;
  char *pcVar2;
  TriggerStep *z;
  
  if (pParse->nErr == 0) {
    db = pParse->db;
    pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db,(ulong)pName->n + 0x61);
    if (pTVar1 != (TriggerStep *)0x0) {
      z = pTVar1 + 1;
      memcpy(z,pName->z,(ulong)pName->n);
      sqlite3Dequote((char *)z);
      pTVar1->zTarget = (char *)z;
      pTVar1->op = op;
      pcVar2 = triggerSpanDup(db,zStart,zEnd);
      pTVar1->zSpan = pcVar2;
      if (pParse->eParseMode < 2) {
        return pTVar1;
      }
      sqlite3RenameTokenMap(pParse,pTVar1->zTarget,pName);
      return pTVar1;
    }
  }
  return (TriggerStep *)0x0;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  Parse *pParse,              /* Parser context */
  u8 op,                      /* Trigger opcode */
  Token *pName,               /* The target name */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  if( pParse->nErr ) return 0;
  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
    pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, pTriggerStep->zTarget, pName);
    }
  }
  return pTriggerStep;
}